

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_shli_i32_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  uintptr_t o_2;
  TCGv_i32 pTVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  uintptr_t o;
  
  if (arg2 != 0) {
    pTVar1 = tcg_const_i32_sparc64(tcg_ctx,arg2);
    pTVar2 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_shl_i32);
    pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar2->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    pTVar2->args[2] = (TCGArg)(pTVar1 + (long)tcg_ctx);
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return;
  }
  if (ret != arg1) {
    pTVar2 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_mov_i32);
    pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar2->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  }
  return;
}

Assistant:

void tcg_gen_shli_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    tcg_debug_assert(arg2 >= 0 && arg2 < 32);
    if (arg2 == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_shl_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}